

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void def_symbol(c2m_ctx_t c2m_ctx,symbol_mode mode,node_t_conflict id,node_t_conflict scope,
               node_t_conflict def_node,node_code_t linkage)

{
  void *pvVar1;
  ulong uVar2;
  undefined8 uVar3;
  type *type1;
  symbol_t symbol;
  int iVar4;
  pos_t pVar5;
  char *local_108;
  undefined8 local_100;
  char *local_f8;
  undefined8 local_f0;
  char *local_e8;
  undefined8 local_e0;
  char *local_d8;
  undefined8 local_d0;
  char *local_c8;
  undefined8 local_c0;
  char *local_b8;
  undefined8 local_b0;
  byte local_a8;
  decl_spec decl_spec;
  decl_spec tab_decl_spec;
  symbol_t sym;
  node_code_t linkage_local;
  node_t_conflict def_node_local;
  node_t_conflict scope_local;
  node_t_conflict id_local;
  symbol_mode mode_local;
  c2m_ctx_t c2m_ctx_local;
  
  if (id->code != N_IGNORE) {
    if ((id->code != N_ID) || (scope == (node_t_conflict)0x0)) {
      __assert_fail("id->code == N_ID && scope != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x1975,
                    "void def_symbol(c2m_ctx_t, enum symbol_mode, node_t, node_t, node_t, node_code_t)"
                   );
    }
    if (((((scope->code != N_MODULE) && (scope->code != N_BLOCK)) && (scope->code != N_STRUCT)) &&
        ((scope->code != N_UNION && (scope->code != N_FUNC)))) && (scope->code != N_FOR)) {
      __assert_fail("scope->code == N_MODULE || scope->code == N_BLOCK || scope->code == N_STRUCT || scope->code == N_UNION || scope->code == N_FUNC || scope->code == N_FOR"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x1977,
                    "void def_symbol(c2m_ctx_t, enum symbol_mode, node_t, node_t, node_t, node_code_t)"
                   );
    }
    pvVar1 = def_node->attr;
    uVar2 = *(ulong *)((long)pvVar1 + 0x28);
    uVar3 = *(undefined8 *)((long)pvVar1 + 0x38);
    type1 = *(type **)((long)pvVar1 + 0x40);
    local_a8 = (byte)uVar2;
    if ((((local_a8 >> 5 & 1) != 0) && ((local_a8 >> 2 & 1) == 0)) && ((local_a8 >> 1 & 1) == 0)) {
      pVar5 = get_node_pos(c2m_ctx,id);
      local_b8 = pVar5.fname;
      local_b0 = pVar5._8_8_;
      error(c2m_ctx,0x1d66fd,local_b8,local_b0,(id->u).s.s);
    }
    iVar4 = symbol_find(c2m_ctx,mode,id,scope,(symbol_t *)&tab_decl_spec.type);
    if (iVar4 == 0) {
      symbol_insert(c2m_ctx,mode,id,scope,def_node,(node_t_conflict)0x0);
    }
    else {
      pvVar1 = (sym.scope)->attr;
      tab_decl_spec._0_8_ = *(undefined8 *)((long)pvVar1 + 0x30);
      tab_decl_spec.align_node = *(node_t_conflict *)((long)pvVar1 + 0x38);
      tab_decl_spec._16_8_ = *(undefined8 *)((long)pvVar1 + 0x40);
      if (((def_node->code == N_ENUM_CONST) || ((sym.scope)->code == N_ENUM_CONST)) &&
         (def_node->code != (sym.scope)->code)) {
        pVar5 = get_node_pos(c2m_ctx,id);
        local_c8 = pVar5.fname;
        local_c0 = pVar5._8_8_;
        error(c2m_ctx,0x1d6721,local_c8,local_c0,(id->u).s.s);
      }
      else {
        decl_spec.type._0_1_ = (byte)*(ulong *)((long)pvVar1 + 0x28);
        if (linkage == N_IGNORE) {
          if ((((uVar2 & 1) == 0) || ((*(ulong *)((long)pvVar1 + 0x28) & 1) == 0)) ||
             (iVar4 = type_eq_p(type1,(type *)tab_decl_spec._16_8_), iVar4 == 0)) {
            pVar5 = get_node_pos(c2m_ctx,id);
            local_d8 = pVar5.fname;
            local_d0 = pVar5._8_8_;
            error(c2m_ctx,0x1d674d,local_d8,local_d0,(id->u).s.s);
          }
        }
        else {
          iVar4 = compatible_types_p(type1,(type *)tab_decl_spec._16_8_,0);
          if (iVar4 == 0) {
            pVar5 = get_node_pos(c2m_ctx,id);
            local_e8 = pVar5.fname;
            local_e0 = pVar5._8_8_;
            error(c2m_ctx,0x1d6765,local_e8,local_e0,(id->u).s.s);
          }
        }
        if (((byte)decl_spec.type >> 5 & 1) != (local_a8 >> 5 & 1)) {
          pVar5 = get_node_pos(c2m_ctx,id);
          local_f8 = pVar5.fname;
          local_f0 = pVar5._8_8_;
          error(c2m_ctx,0x1d678b,local_f8,local_f0,(id->u).s.s);
        }
        decl_spec.align_node._0_4_ = (int)uVar3;
        if ((((int)decl_spec.align_node == 0x58) && (linkage == N_STATIC)) ||
           (((int)decl_spec.align_node == 0x59 && (linkage == N_EXTERN)))) {
          pVar5 = get_node_pos(c2m_ctx,id);
          local_108 = pVar5.fname;
          local_100 = pVar5._8_8_;
          warning(c2m_ctx,0x1d67c0,local_108,local_100,(id->u).s.s);
        }
        VARR_node_tpush((VARR_node_t *)sym.aux_node,def_node);
        iVar4 = incomplete_type_p(c2m_ctx,(type *)tab_decl_spec._16_8_);
        if (iVar4 != 0) {
          symbol.id = (node_t_conflict)sym._0_8_;
          symbol._0_8_ = tab_decl_spec.type;
          symbol.scope = sym.id;
          symbol.def_node = sym.scope;
          symbol.aux_node = sym.def_node;
          symbol.defs = (VARR_node_t *)sym.aux_node;
          symbol_def_replace(c2m_ctx,symbol,def_node);
        }
      }
    }
  }
  return;
}

Assistant:

static void def_symbol (c2m_ctx_t c2m_ctx, enum symbol_mode mode, node_t id, node_t scope,
                        node_t def_node, node_code_t linkage) {
  symbol_t sym;
  struct decl_spec tab_decl_spec, decl_spec;

  if (id->code == N_IGNORE) return;
  assert (id->code == N_ID && scope != NULL);
  assert (scope->code == N_MODULE || scope->code == N_BLOCK || scope->code == N_STRUCT
          || scope->code == N_UNION || scope->code == N_FUNC || scope->code == N_FOR);
  decl_spec = ((decl_t) def_node->attr)->decl_spec;
  if (decl_spec.thread_local_p && !decl_spec.static_p && !decl_spec.extern_p)
    error (c2m_ctx, POS (id), "auto %s is declared as thread local", id->u.s.s);
  if (!symbol_find (c2m_ctx, mode, id, scope, &sym)) {
    symbol_insert (c2m_ctx, mode, id, scope, def_node, NULL);
    return;
  }
  tab_decl_spec = ((decl_t) sym.def_node->attr)->decl_spec;
  if ((def_node->code == N_ENUM_CONST || sym.def_node->code == N_ENUM_CONST)
      && def_node->code != sym.def_node->code) {
    error (c2m_ctx, POS (id), "%s redeclared as a different kind of symbol", id->u.s.s);
    return;
  } else if (linkage == N_IGNORE) {
    if (!decl_spec.typedef_p || !tab_decl_spec.typedef_p
        || !type_eq_p (decl_spec.type, tab_decl_spec.type))
#if defined(__APPLE__)
      /* a hack to use our definition instead of macosx for non-GNU compiler */
      if (strcmp (id->u.s.s, "__darwin_va_list") != 0)
#endif
        error (c2m_ctx, POS (id), "repeated declaration %s", id->u.s.s);
  } else if (!compatible_types_p (decl_spec.type, tab_decl_spec.type, FALSE)) {
    error (c2m_ctx, POS (id), "incompatible types of %s declarations", id->u.s.s);
  }
  if (tab_decl_spec.thread_local_p != decl_spec.thread_local_p) {
    error (c2m_ctx, POS (id), "thread local and non-thread local declarations of %s", id->u.s.s);
  }
  if ((decl_spec.linkage == N_EXTERN && linkage == N_STATIC)
      || (decl_spec.linkage == N_STATIC && linkage == N_EXTERN))
    warning (c2m_ctx, POS (id), "%s defined with external and internal linkage", id->u.s.s);
  VARR_PUSH (node_t, sym.defs, def_node);
  if (incomplete_type_p (c2m_ctx, tab_decl_spec.type)) symbol_def_replace (c2m_ctx, sym, def_node);
}